

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  char *pcVar1;
  allocator local_21;
  String local_20;
  
  pcVar1 = "unknown file";
  if (this != (internal *)0x0) {
    pcVar1 = (char *)this;
  }
  if ((int)file < 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_20);
  }
  else {
    String::Format((char *)&local_20,"%s:%d");
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_20.c_str_,&local_21);
    String::~String(&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(
    const char* file, int line) {
  const char* const file_name = file == NULL ? kUnknownFile : file;

  if (line < 0)
    return file_name;
  else
    return String::Format("%s:%d", file_name, line).c_str();
}